

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O3

void __thiscall QTableWidgetItem::setData(QTableWidgetItem *this,int role,QVariant *value)

{
  char cVar1;
  long lVar2;
  QTableModel *this_00;
  pointer pQVar3;
  QWidgetItemData *pQVar4;
  int iVar5;
  long lVar6;
  undefined8 uVar7;
  long in_FS_OFFSET;
  QArrayData *d;
  QWidgetItemData local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar5 = 0;
  if (role != 2) {
    iVar5 = role;
  }
  lVar2 = (this->values).d.size;
  if (lVar2 != 0) {
    pQVar4 = (this->values).d.ptr;
    lVar6 = -8;
    do {
      if (pQVar4->role == iVar5) {
        pQVar3 = QList<QWidgetItemData>::data(&this->values);
        cVar1 = ::QVariant::equals((QVariant *)((long)pQVar3 - lVar6));
        if (cVar1 != '\0') goto LAB_005942a2;
        pQVar3 = QList<QWidgetItemData>::data(&this->values);
        ::QVariant::operator=((QVariant *)((long)pQVar3 - lVar6),value);
        goto LAB_005941a1;
      }
      lVar6 = lVar6 + -0x28;
      pQVar4 = pQVar4 + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  local_58.role = iVar5;
  ::QVariant::QVariant(&local_58.value,value);
  QtPrivate::QMovableArrayOps<QWidgetItemData>::emplace<QWidgetItemData>
            ((QMovableArrayOps<QWidgetItemData> *)&this->values,(this->values).d.size,&local_58);
  QList<QWidgetItemData>::end(&this->values);
  ::QVariant::~QVariant((QVariant *)&local_58.value);
LAB_005941a1:
  this_00 = tableModel(this);
  if (this_00 != (QTableModel *)0x0) {
    if (iVar5 == 0) {
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      uVar7 = 2;
      local_58.value.d.data.shared =
           (PrivateShared *)QArrayData::allocate((QArrayData **)&local_58,4,0x10,2,KeepSize);
      *(undefined8 *)local_58.value.d.data.shared = 0x200000000;
    }
    else {
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      uVar7 = 1;
      local_58.value.d.data.shared =
           (PrivateShared *)QArrayData::allocate((QArrayData **)&local_58,4,0x10,1,KeepSize);
      *(int *)local_58.value.d.data.shared = iVar5;
    }
    local_58.value.d.data._8_8_ = uVar7;
    QTableModel::itemChanged(this_00,this,(QList<int> *)&local_58);
    if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_58._0_8_,4,0x10);
      }
    }
  }
LAB_005942a2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableWidgetItem::setData(int role, const QVariant &value)
{
    bool found = false;
    role = (role == Qt::EditRole ? Qt::DisplayRole : role);
    for (int i = 0; i < values.size(); ++i) {
        if (values.at(i).role == role) {
            if (values[i].value == value)
                return;

            values[i].value = value;
            found = true;
            break;
        }
    }
    if (!found)
        values.append(QWidgetItemData(role, value));
    if (QTableModel *model = tableModel())
    {
        const QList<int> roles((role == Qt::DisplayRole)
                                       ? QList<int>({ Qt::DisplayRole, Qt::EditRole })
                                       : QList<int>({ role }));
        model->itemChanged(this, roles);
    }
}